

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void sx_coro_destroy_context(sx_coro_context *ctx)

{
  int iVar1;
  sx_alloc *alloc_00;
  code *pcVar2;
  sx__coro_state *state;
  int i;
  int capacity;
  sx__pool_page *page;
  sx_alloc *alloc;
  sx_coro_context *ctx_local;
  
  if (ctx == (sx_coro_context *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xc2,"ctx");
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  alloc_00 = ctx->alloc;
  if (ctx->coro_pool != (sx_pool *)0x0) {
    iVar1 = ctx->coro_pool->capacity;
    for (_i = ctx->coro_pool->pages; _i != (sx__pool_page *)0x0; _i = _i->next) {
      for (state._0_4_ = _i->iter; (int)state < iVar1; state._0_4_ = (int)state + 1) {
        if ((*(byte *)((long)_i->ptrs[(int)state] + 0x48) & 1) != 0) {
          sx_fiber_stack_release((sx_fiber_stack *)((long)_i->ptrs[(int)state] + 8));
        }
      }
    }
    sx_pool_destroy(ctx->coro_pool,alloc_00);
    sx__free(alloc_00,ctx,0,(char *)0x0,(char *)0x0,0);
  }
  return;
}

Assistant:

void sx_coro_destroy_context(sx_coro_context* ctx)
{
    sx_assert(ctx);

    const sx_alloc* alloc = ctx->alloc;
    if (ctx->coro_pool) {
        // TODO: release fiber's stack memory
        sx__pool_page* page = ctx->coro_pool->pages;
        int capacity = ctx->coro_pool->capacity;
        while (page) {
            for (int i = page->iter; i < capacity; i++) {
                sx__coro_state* state = page->ptrs[i];
                if (state->init) {
                    sx_fiber_stack_release(&state->stack_mem);
                }
            }
            page = page->next;
        }

        sx_pool_destroy(ctx->coro_pool, alloc);
        sx_free(alloc, ctx);
    }
}